

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O2

fdb_status fdb_kvs_close(fdb_kvs_handle *handle)

{
  kvs_info *pkVar1;
  fdb_status fVar2;
  fdb_file_handle *pfVar3;
  
  if (handle == (fdb_kvs_handle *)0x0) {
    return FDB_RESULT_INVALID_HANDLE;
  }
  if (handle->num_iterators != 0) {
    return FDB_RESULT_KV_STORE_BUSY;
  }
  pkVar1 = handle->kvs;
  if (handle->shandle == (snap_handle *)0x0) {
    if (pkVar1 != (kvs_info *)0x0) goto LAB_00143659;
  }
  else {
    if (pkVar1 == (kvs_info *)0x0) {
      fVar2 = _fdb_close(handle);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        return fVar2;
      }
      goto LAB_0014372f;
    }
LAB_00143659:
    if (pkVar1->type != '\0') {
      if (pkVar1->root == (fdb_kvs_handle *)0x0) {
        return FDB_RESULT_INVALID_ARGS;
      }
      fVar2 = _fdb_kvs_close(handle);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        return fVar2;
      }
      fdb_kvs_info_free(handle);
      goto LAB_0014372f;
    }
  }
  pfVar3 = handle->fhandle;
  if (pfVar3->root == handle) {
    fdb_assert_die("handle->fhandle->root != handle",
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/kv_instance.cc"
                   ,0x78e,(uint64_t)handle,0);
    pfVar3 = handle->fhandle;
  }
  pthread_spin_lock(&pfVar3->lock);
  fVar2 = _fdb_close(handle);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    pthread_spin_unlock(&handle->fhandle->lock);
    return fVar2;
  }
  if (handle->kvs != (kvs_info *)0x0) {
    fdb_kvs_info_free(handle);
  }
  list_remove(handle->fhandle->handles,&handle->node->le);
  pthread_spin_unlock(&handle->fhandle->lock);
  free(handle->node);
LAB_0014372f:
  free(handle);
  return FDB_RESULT_SUCCESS;
}

Assistant:

fdb_status _fdb_kvs_close(fdb_kvs_handle *handle)
{
    fdb_kvs_handle *root_handle = handle->fhandle->root;
    fdb_status fs;

    if (handle->node) {
        spin_lock(&root_handle->fhandle->lock);
        list_remove(root_handle->fhandle->handles, &handle->node->le);
        spin_unlock(&root_handle->fhandle->lock);
        free(handle->node);
    } // 'handle->node == NULL' happens only during rollback

    fs = _fdb_close(handle);
    return fs;
}